

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSSLRSAPrivateKey.cpp
# Opt level: O3

void __thiscall OSSLRSAPrivateKey::createOSSLKey(OSSLRSAPrivateKey *this)

{
  RSA *rsa;
  RSA_METHOD *meth;
  BIGNUM *pBVar1;
  BIGNUM *pBVar2;
  BIGNUM *pBVar3;
  BIGNUM *pBVar4;
  BIGNUM *pBVar5;
  BIGNUM *pBVar6;
  BIGNUM *pBVar7;
  BIGNUM *pBVar8;
  
  if (this->rsa != (RSA *)0x0) {
    return;
  }
  rsa = RSA_new();
  this->rsa = (RSA *)rsa;
  if (rsa != (RSA *)0x0) {
    meth = (RSA_METHOD *)RSA_PKCS1_OpenSSL();
    RSA_set_method(rsa,meth);
    pBVar1 = OSSL::byteString2bn(&(this->super_RSAPrivateKey).p);
    pBVar2 = OSSL::byteString2bn(&(this->super_RSAPrivateKey).q);
    pBVar3 = OSSL::byteString2bn(&(this->super_RSAPrivateKey).dp1);
    pBVar4 = OSSL::byteString2bn(&(this->super_RSAPrivateKey).dq1);
    pBVar5 = OSSL::byteString2bn(&(this->super_RSAPrivateKey).pq);
    pBVar6 = OSSL::byteString2bn(&(this->super_RSAPrivateKey).n);
    pBVar7 = OSSL::byteString2bn(&(this->super_RSAPrivateKey).e);
    pBVar8 = OSSL::byteString2bn(&(this->super_RSAPrivateKey).d);
    RSA_set0_factors(this->rsa,pBVar1,pBVar2);
    RSA_set0_crt_params(this->rsa,pBVar3,pBVar4,pBVar5);
    RSA_set0_key(this->rsa,pBVar6,pBVar7,pBVar8);
    return;
  }
  softHSMLog(3,"createOSSLKey",
             "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLRSAPrivateKey.cpp"
             ,0x11f,"Could not create RSA object");
  return;
}

Assistant:

void OSSLRSAPrivateKey::createOSSLKey()
{
	if (rsa != NULL) return;

	rsa = RSA_new();
	if (rsa == NULL)
	{
		ERROR_MSG("Could not create RSA object");
		return;
	}

	// Use the OpenSSL implementation and not any engine
#if OPENSSL_VERSION_NUMBER < 0x10100000L || defined(LIBRESSL_VERSION_NUMBER)

#ifdef WITH_FIPS
	if (FIPS_mode())
		RSA_set_method(rsa, FIPS_rsa_pkcs1_ssleay());
	else
		RSA_set_method(rsa, RSA_PKCS1_SSLeay());
#else
	RSA_set_method(rsa, RSA_PKCS1_SSLeay());
#endif

#else
	RSA_set_method(rsa, RSA_PKCS1_OpenSSL());
#endif

	BIGNUM* bn_p = OSSL::byteString2bn(p);
	BIGNUM* bn_q = OSSL::byteString2bn(q);
	BIGNUM* bn_dmp1 = OSSL::byteString2bn(dp1);
	BIGNUM* bn_dmq1 = OSSL::byteString2bn(dq1);
	BIGNUM* bn_iqmp = OSSL::byteString2bn(pq);
	BIGNUM* bn_n = OSSL::byteString2bn(n);
	BIGNUM* bn_e = OSSL::byteString2bn(e);
	BIGNUM* bn_d = OSSL::byteString2bn(d);

	RSA_set0_factors(rsa, bn_p, bn_q);
	RSA_set0_crt_params(rsa, bn_dmp1, bn_dmq1, bn_iqmp);
	RSA_set0_key(rsa, bn_n, bn_e, bn_d);
}